

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O1

char * __thiscall OSToken::index(OSToken *this,char *__s,int __c)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ObjectFile *pOVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  size_type *psVar10;
  long *plVar11;
  string *__return_storage_ptr__;
  char cVar12;
  _Self __tmp;
  pointer __v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> newObjects;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newSet;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFiles;
  MutexLocker lock;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  removedFiles;
  undefined1 local_1e8 [32];
  _Rb_tree_node_base *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  long local_1b0;
  long lStack_1a8;
  string local_1a0;
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  local_180;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
  *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  MutexLocker local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__ = (string *)((ulong)__s & 0xffffffff);
  MutexLocker::MutexLocker(&local_b0,this->tokenMutex);
  if (((int)__s != 0) ||
     ((this->valid == true && (bVar2 = Generation::wasUpdated(this->gen), bVar2)))) {
    bVar2 = Directory::refresh(this->tokenDir);
    if ((bVar2) && (this->tokenObject->valid != false)) {
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x260,"Token %s has changed",(this->tokenPath)._M_dataplus._M_p);
      Directory::getFiles_abi_cxx11_(&local_128,this->tokenDir);
      local_110._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_110._M_impl.super__Rb_tree_header._M_header;
      local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_110._M_impl.super__Rb_tree_header._M_header._M_right =
           local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __v = local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar5 = __v->_M_string_length;
          if (uVar5 < 8) {
LAB_00129d65:
            bVar2 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)local_50,(ulong)__v);
            iVar3 = std::__cxx11::string::compare((char *)local_50);
            if (iVar3 != 0) goto LAB_00129d65;
            iVar3 = std::__cxx11::string::compare((char *)__v);
            bVar2 = iVar3 != 0;
          }
          if ((7 < uVar5) && (local_50[0] != local_40)) {
            operator_delete(local_50[0]);
          }
          if (bVar2) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_110,__v);
          }
          else {
            softHSMLog(7,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x272,"Ignored file %s",(__v->_M_dataplus)._M_p);
          }
          __v = __v + 1;
        } while (__v != local_128.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_e0._M_impl.super__Rb_tree_header._M_header;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a0._M_impl.super__Rb_tree_header._M_header;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((char)__return_storage_ptr__ == '\0') {
        if ((_Rb_tree_header *)local_110._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_110._M_impl.super__Rb_tree_header) {
          p_Var8 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&(this->currentFiles)._M_t,(key_type *)(p_Var8 + 1));
            if ((_Rb_tree_header *)iVar9._M_node ==
                &(this->currentFiles)._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var8 + 1));
            }
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          } while ((_Rb_tree_header *)p_Var8 != &local_110._M_impl.super__Rb_tree_header);
        }
        p_Var8 = (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        __return_storage_ptr__ = (string *)&(this->currentFiles)._M_t._M_impl.super__Rb_tree_header;
        if (p_Var8 != (_Base_ptr)__return_storage_ptr__) {
          do {
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_110,(key_type *)(p_Var8 + 1));
            if ((_Rb_tree_header *)iVar9._M_node == &local_110._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var8 + 1));
            }
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          } while (p_Var8 != (_Base_ptr)__return_storage_ptr__);
        }
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_e0,&local_110);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this->currentFiles)._M_t,&local_110);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x295,"%d objects were added and %d objects were removed",
                 local_e0._M_impl.super__Rb_tree_header._M_node_count,
                 local_a0._M_impl.super__Rb_tree_header._M_node_count);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x296,"Current directory set contains %d objects");
      if ((_Rb_tree_header *)local_e0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_e0._M_impl.super__Rb_tree_header) {
        local_1c8 = (_Rb_tree_node_base *)&this->objects;
        local_130 = (_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                     *)&this->allObjects;
        __return_storage_ptr__ = (string *)local_1e8;
        p_Var8 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          cVar12 = (char)(p_Var8 + 1);
          lVar4 = std::__cxx11::string::rfind(cVar12,0x2e);
          if (lVar4 == -1) {
            bVar2 = true;
          }
          else {
            std::__cxx11::string::rfind(cVar12,0x2e);
            std::__cxx11::string::substr((ulong)local_70,(ulong)(p_Var8 + 1));
            iVar3 = std::__cxx11::string::compare((char *)local_70);
            bVar2 = iVar3 != 0;
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
          }
          if (!bVar2) {
            local_180._M_impl._0_8_ = &local_180._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,*(long *)(p_Var8 + 1),
                       (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
            uVar5 = std::__cxx11::string::rfind((char)(string *)&local_180,0x2e);
            std::__cxx11::string::replace
                      ((ulong)&local_180,uVar5,(char *)0xffffffffffffffff,0x13ca52);
            pOVar6 = (ObjectFile *)operator_new(0xb0);
            local_1e8._0_8_ = local_1e8 + 0x10;
            pcVar1 = (this->tokenPath)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar1,
                       pcVar1 + (this->tokenPath)._M_string_length);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)__return_storage_ptr__,*(ulong *)(p_Var8 + 1));
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1a0.field_2._M_allocated_capacity = *psVar10;
              local_1a0.field_2._8_4_ = (undefined4)plVar7[3];
              local_1a0.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
            }
            else {
              local_1a0.field_2._M_allocated_capacity = *psVar10;
              local_1a0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1a0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            iVar3 = this->umask;
            local_150[0] = local_140;
            pcVar1 = (this->tokenPath)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_150,pcVar1,pcVar1 + (this->tokenPath)._M_string_length);
            std::__cxx11::string::append((char *)local_150);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_150,local_180._M_impl._0_8_);
            local_1c0._M_allocated_capacity = (size_type)&local_1b0;
            plVar11 = plVar7 + 2;
            if ((long *)*plVar7 == plVar11) {
              local_1b0 = *plVar11;
              lStack_1a8 = plVar7[3];
            }
            else {
              local_1b0 = *plVar11;
              local_1c0._M_allocated_capacity = (size_type)(long *)*plVar7;
            }
            local_1c0._8_8_ = plVar7[1];
            *plVar7 = (long)plVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ObjectFile::ObjectFile(pOVar6,this,&local_1a0,iVar3,(string *)&local_1c0,false);
            if ((long *)local_1c0._M_allocated_capacity != &local_1b0) {
              operator_delete((void *)local_1c0._M_allocated_capacity);
            }
            if (local_150[0] != local_140) {
              operator_delete(local_150[0]);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p);
            }
            if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
              operator_delete((void *)local_1e8._0_8_);
            }
            ObjectFile::getFilename_abi_cxx11_(__return_storage_ptr__,pOVar6);
            softHSMLog(7,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x2ac,"(0x%08X) New object %s (0x%08X) added",this,local_1e8._0_8_,pOVar6);
            if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
              operator_delete((void *)local_1e8._0_8_);
            }
            local_1e8._0_8_ = pOVar6;
            std::
            _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
            ::_M_insert_unique<OSObject*>
                      ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                        *)local_1c8,(OSObject **)__return_storage_ptr__);
            local_1e8._0_8_ = pOVar6;
            std::
            _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
            ::_M_insert_unique<OSObject*>(local_130,(OSObject **)__return_storage_ptr__);
            if ((_Base_ptr *)local_180._M_impl._0_8_ !=
                &local_180._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_180._M_impl._0_8_);
            }
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != &local_e0._M_impl.super__Rb_tree_header);
      }
      local_180._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_180 + 8);
      local_180._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_180._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_180._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var8 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1c8 = &(this->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      uVar5 = CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),p_Var8 == local_1c8);
      local_180._M_impl.super__Rb_tree_header._M_header._M_right =
           local_180._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var8 != local_1c8) {
        do {
          lVar4 = *(long *)(p_Var8 + 1);
          if (lVar4 == 0) {
            pOVar6 = (ObjectFile *)0x0;
          }
          else {
            pOVar6 = (ObjectFile *)__dynamic_cast(lVar4,&OSObject::typeinfo,&ObjectFile::typeinfo,0)
            ;
          }
          if (pOVar6 == (ObjectFile *)0x0) {
            softHSMLog(3,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x2b9,"Object type not compatible with this token class 0x%08X",lVar4);
          }
          else {
            ObjectFile::getFilename_abi_cxx11_((string *)local_1e8,pOVar6);
            softHSMLog(7,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x2be,"Processing %s (0x%08X)",local_1e8._0_8_,*(OSObject **)(p_Var8 + 1));
            if ((ObjectFile *)local_1e8._0_8_ != (ObjectFile *)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_);
            }
            ObjectFile::getFilename_abi_cxx11_((string *)local_1e8,pOVar6);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_a0,(string *)local_1e8);
            if ((ObjectFile *)local_1e8._0_8_ != (ObjectFile *)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_);
            }
            if ((_Rb_tree_header *)iVar9._M_node == &local_a0._M_impl.super__Rb_tree_header) {
              ObjectFile::getFilename_abi_cxx11_((string *)local_1e8,pOVar6);
              softHSMLog(7,"index",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                         ,0x2c2,"Adding object %s",local_1e8._0_8_);
              if ((ObjectFile *)local_1e8._0_8_ != (ObjectFile *)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_);
              }
              std::
              _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
              ::_M_insert_unique<OSObject*const&>
                        ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                          *)&local_180,(OSObject **)(p_Var8 + 1));
            }
            else {
              ObjectFile::invalidate(pOVar6);
            }
          }
          if (pOVar6 == (ObjectFile *)0x0) goto LAB_0012a5a5;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          uVar5 = CONCAT71((int7)(uVar5 >> 8),p_Var8 == local_1c8);
        } while (p_Var8 != local_1c8);
      }
      std::
      _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
      ::operator=(&(this->objects)._M_t,&local_180);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x2cf,"The token now contains %d objects",
                 (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_0012a5a5:
      std::
      _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
      ::~_Rb_tree(&local_180);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_e0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_110);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128);
    }
    else {
      softHSMLog(3,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x259,"Token integrity check failed");
      this->valid = false;
      uVar5 = 0;
    }
  }
  else {
    uVar5 = CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),1);
    softHSMLog(7,"index",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x251,"No re-indexing is required");
  }
  MutexLocker::~MutexLocker(&local_b0);
  return (char *)(uVar5 & 0xffffff01);
}

Assistant:

bool OSToken::index(bool isFirstTime /* = false */)
{
	// No access to object mutable fields before
	MutexLocker lock(tokenMutex);

	// Check if re-indexing is required
	if (!isFirstTime && (!valid || !gen->wasUpdated()))
	{
		DEBUG_MSG("No re-indexing is required");

		return true;
	}

	// Check the integrity
	if (!tokenDir->refresh() || !tokenObject->valid)
	{
		ERROR_MSG("Token integrity check failed");

		valid = false;

		return false;
	}

	DEBUG_MSG("Token %s has changed", tokenPath.c_str());

	// Retrieve the directory listing
	std::vector<std::string> tokenFiles = tokenDir->getFiles();

	// Filter out the objects
	std::set<std::string> newSet;

	for (std::vector<std::string>::iterator i = tokenFiles.begin(); i != tokenFiles.end(); i++)
	{
		if ((i->size() > 7) &&
		    (!(i->substr(i->size() - 7).compare(".object"))) &&
		    (i->compare("token.object")))
		{
			newSet.insert(*i);
		}
		else
		{
			DEBUG_MSG("Ignored file %s", i->c_str());
		}
	}

	// Compute the changes compared to the last list of files
	std::set<std::string> addedFiles;
	std::set<std::string> removedFiles;

	if (!isFirstTime)
	{
		// First compute which files were added
		for (std::set<std::string>::iterator i = newSet.begin(); i != newSet.end(); i++)
		{
			if (currentFiles.find(*i) == currentFiles.end())
			{
				addedFiles.insert(*i);
			}
		}

		// Now compute which files were removed
		for (std::set<std::string>::iterator i = currentFiles.begin(); i != currentFiles.end(); i++)
		{
			if (newSet.find(*i) == newSet.end())
			{
				removedFiles.insert(*i);
			}
		}
	}
	else
	{
		addedFiles = newSet;
	}

	currentFiles = newSet;

	DEBUG_MSG("%d objects were added and %d objects were removed", addedFiles.size(), removedFiles.size());
	DEBUG_MSG("Current directory set contains %d objects", currentFiles.size());

	// Now update the set of objects

	// Add new objects
	for (std::set<std::string>::iterator i = addedFiles.begin(); i != addedFiles.end(); i++)
	{
		if ((i->find_last_of('.') == std::string::npos) ||
		    (i->substr(i->find_last_of('.')) != ".object"))
		{
			continue;
		}

		std::string lockName(*i);
		lockName.replace(lockName.find_last_of('.'), std::string::npos, ".lock");

		// Create a new token object for the added file
		ObjectFile* newObject = new ObjectFile(this, tokenPath + OS_PATHSEP + *i, umask, tokenPath + OS_PATHSEP + lockName);

		// Add the object, even invalid ones.
		// This is so the we can read the attributes once
		// the other process has finished writing to disc.
		DEBUG_MSG("(0x%08X) New object %s (0x%08X) added", this, newObject->getFilename().c_str(), newObject);
		objects.insert(newObject);
		allObjects.insert(newObject);
	}

	// Remove deleted objects
	std::set<OSObject*> newObjects;

	for (std::set<OSObject*>::iterator i = objects.begin(); i != objects.end(); i++)
	{
		ObjectFile* fileObject = dynamic_cast<ObjectFile*>((*i));
		if (fileObject == NULL)
		{
			ERROR_MSG("Object type not compatible with this token class 0x%08X", (*i));

			return false;
		}

		DEBUG_MSG("Processing %s (0x%08X)", fileObject->getFilename().c_str(), *i);

		if (removedFiles.find(fileObject->getFilename()) == removedFiles.end())
		{
			DEBUG_MSG("Adding object %s", fileObject->getFilename().c_str());
			// This object gets to stay in the set
			newObjects.insert(*i);
		}
		else
		{
			fileObject->invalidate();
		}
	}

	// Set the new objects
	objects = newObjects;

	DEBUG_MSG("The token now contains %d objects", objects.size());

	return true;
}